

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true> * __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true>::
operator=(OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true> *this,
         FixedSizeInfo *y)

{
  bool bVar1;
  FixedSizeInfo *y_local;
  OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    *(undefined4 *)&this->field_0 = *(undefined4 *)y;
    (this->field_0).value.NumDwarfOffsets = y->NumDwarfOffsets;
  }
  else {
    *(undefined4 *)&this->field_0 = *(undefined4 *)y;
    *(undefined2 *)((long)&this->field_0 + 4) = *(undefined2 *)&y->NumDwarfOffsets;
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T &&y) {
    if (hasValue()) {
      value = std::move(y);
    } else {
      ::new ((void *)std::addressof(value)) T(std::move(y));
      hasVal = true;
    }
    return *this;
  }